

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scale.h
# Opt level: O2

void Gs::Details::Scale3x3<Gs::AffineMatrix4T<float>,float>
               (AffineMatrix4T<float> *m,Vector3T<float> *v)

{
  m->m_[0] = v->x * m->m_[0];
  m->m_[1] = v->x * m->m_[1];
  m->m_[2] = v->x * m->m_[2];
  m->m_[3] = v->y * m->m_[3];
  m->m_[4] = v->y * m->m_[4];
  m->m_[5] = v->y * m->m_[5];
  m->m_[6] = v->z * m->m_[6];
  m->m_[7] = v->z * m->m_[7];
  m->m_[8] = v->z * m->m_[8];
  return;
}

Assistant:

void Scale3x3(M& m, const Vector3T<T>& v)
{
    GS_ASSERT_MxN_MATRIX("scale with 3D vector", M, 3, 3);

    m.At(0, 0) *= v.x;
    m.At(1, 0) *= v.x;
    m.At(2, 0) *= v.x;

    m.At(0, 1) *= v.y;
    m.At(1, 1) *= v.y;
    m.At(2, 1) *= v.y;

    m.At(0, 2) *= v.z;
    m.At(1, 2) *= v.z;
    m.At(2, 2) *= v.z;
}